

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

QpSolverStatus __thiscall
CholeskyFactor::expand(CholeskyFactor *this,QpVector *yp,QpVector *gyp,QpVector *l,QpVector *m)

{
  pointer pdVar1;
  QpSolverStatus QVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  QVar2 = OK;
  if (this->uptodate == true) {
    dVar7 = QpVector::dot(gyp,yp);
    QpVector::resparsify(l);
    dVar8 = QpVector::norm2(l);
    dVar7 = dVar7 - dVar8;
    if (dVar7 <= 0.0) {
      QVar2 = NOTPOSITIVDEFINITE;
    }
    else {
      iVar3 = this->current_k;
      iVar4 = this->current_k_max;
      if (iVar4 <= iVar3 + 1) {
        resize(this,iVar4 * 2);
        iVar3 = this->current_k;
        iVar4 = this->current_k_max;
      }
      pdVar1 = (l->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
        *pdVar5 = pdVar1[lVar6];
        pdVar5 = pdVar5 + iVar4;
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      iVar3 = this->current_k;
      (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[(this->current_k_max + 1) * iVar3] = dVar7;
      this->current_k = iVar3 + 1;
      QVar2 = OK;
    }
  }
  return QVar2;
}

Assistant:

QpSolverStatus expand(const QpVector& yp, QpVector& gyp, QpVector& l,
                        QpVector& m) {
    if (!uptodate) {
      return QpSolverStatus::OK;
    }
    double mu = gyp * yp;
    l.resparsify();
    double lambda = mu - l.norm2();
    if (lambda > 0.0) {
      if (current_k_max <= current_k + 1) {
        resize(current_k_max * 2);
      }

      for (HighsInt i = 0; i < current_k; i++) {
        L[i * current_k_max + current_k] = l.value[i];
      }
      L[current_k * current_k_max + current_k] = sqrt(lambda);

      current_k++;
    } else {
      return QpSolverStatus::NOTPOSITIVDEFINITE;

      //     |LL' 0|
      // M = |0'  0| + bb' -aa'
      // a = (k * m, alpha), b = (k * m, beta)
      // b*b -a*a = mu
      // k(b-a) = 1
      // b + a = k*mu
      // Commented out unreachable code
      //      const double tolerance = 0.001;
      //
      //      double beta = max(tolerance, sqrt(m.norm2() / L[0] + fabs(mu)));
      //      double k = 1 / (beta + sqrt(beta * beta - mu));
      //      double alpha = k * mu - beta;
      //
      //      printf("k = %d, alpha = %lf, beta = %lf, k = %lf\n",
      //      (int)current_k, alpha,
      //             beta, k);
      //
      //      a.clear();
      //      a.resize(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        a[i] = k * m.value[i];
      //      }
      //      a[current_k] = alpha;
      //
      //      std::vector<double> b(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        b[i] = k * m.value[i];
      //      }
      //      b[current_k] = beta;
      //
      //      if (current_k_max <= current_k + 1) {
      //        resize(current_k_max * 2);
      //      }
      //
      //      // append b to the left of L
      //      for (HighsInt row = current_k; row > 0; row--) {
      //        // move row one position down
      //        for (HighsInt i = 0; i < current_k; i++) {
      //          L[row * current_k_max + i] = L[(row - 1) * current_k_max + i];
      //        }
      //      }
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        L[i] = b[i];
      //      }
      //
      //      // re-triangulize
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        eliminate(L, i, i + 1, current_k_max, current_k + 1);
      //      }
      //
      //      current_k = current_k + 1;
    }
    return QpSolverStatus::OK;
  }